

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O0

void sha1_ni_block(__m128i *core,uint8_t *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i alVar21;
  __m128i *block;
  __m128i MASK;
  __m128i MSG3;
  __m128i MSG2;
  __m128i MSG1;
  __m128i MSG0;
  __m128i E1;
  __m128i E0;
  __m128i ABCD;
  uint8_t *p_local;
  __m128i *core_local;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  
  auVar16._8_8_ = 0x1020304050607;
  auVar16._0_8_ = 0x8090a0b0c0d0e0f;
  auVar15 = pshufb(*(undefined1 (*) [16])p,auVar16);
  local_898 = (int)core[1][0];
  iStack_894 = (int)((ulong)core[1][0] >> 0x20);
  iStack_890 = (int)core[1][1];
  iStack_88c = (int)((ulong)core[1][1] >> 0x20);
  local_8a8 = auVar15._0_4_;
  iStack_8a4 = auVar15._4_4_;
  iStack_8a0 = auVar15._8_4_;
  iStack_89c = auVar15._12_4_;
  E1[1] = CONCAT44(iStack_894 + iStack_8a4,local_898 + local_8a8);
  E0[0]._0_4_ = iStack_890 + iStack_8a0;
  E0[0]._4_4_ = iStack_88c + iStack_89c;
  auVar16 = sha1rnds4_sha((undefined1  [16])*core,stack0xfffffffffffff648,0);
  auVar17._8_8_ = 0x1020304050607;
  auVar17._0_8_ = 0x8090a0b0c0d0e0f;
  auVar17 = pshufb(*(undefined1 (*) [16])(p + 0x10),auVar17);
  auVar18 = sha1nexte_sha((undefined1  [16])*core,auVar17);
  auVar19 = sha1rnds4_sha(auVar16,auVar18,0);
  auVar15 = sha1msg1_sha(auVar15,auVar17);
  auVar18._8_8_ = 0x1020304050607;
  auVar18._0_8_ = 0x8090a0b0c0d0e0f;
  auVar18 = pshufb(*(undefined1 (*) [16])(p + 0x20),auVar18);
  MSG3[1] = auVar18._0_8_;
  MSG2[0] = auVar18._8_8_;
  auVar16 = sha1nexte_sha(auVar16,auVar18);
  auVar16 = sha1rnds4_sha(auVar19,auVar16,0);
  auVar17 = sha1msg1_sha(auVar17,auVar18);
  MSG1[1] = auVar15._0_8_;
  MSG0[0] = auVar15._8_8_;
  auVar15._8_8_ = 0x1020304050607;
  auVar15._0_8_ = 0x8090a0b0c0d0e0f;
  auVar15 = pshufb(*(undefined1 (*) [16])(p + 0x30),auVar15);
  MASK[1] = auVar15._0_8_;
  MSG3[0] = auVar15._8_8_;
  auVar19 = sha1nexte_sha(auVar19,auVar15);
  auVar14._8_8_ = MSG0[0] ^ MSG2[0];
  auVar14._0_8_ = MSG1[1] ^ MSG3[1];
  auVar20 = sha1msg2_sha(auVar14,auVar15);
  auVar19 = sha1rnds4_sha(auVar16,auVar19,0);
  auVar18 = sha1msg1_sha(auVar18,auVar15);
  MSG2[1] = auVar17._0_8_;
  MSG1[0] = auVar17._8_8_;
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  auVar17 = sha1nexte_sha(auVar16,auVar20);
  auVar13._8_8_ = MSG1[0] ^ MSG3[0];
  auVar13._0_8_ = MSG2[1] ^ MASK[1];
  auVar16 = sha1msg2_sha(auVar13,auVar20);
  auVar17 = sha1rnds4_sha(auVar19,auVar17,0);
  auVar15 = sha1msg1_sha(auVar15,auVar20);
  MSG3[1] = auVar18._0_8_;
  MSG2[0] = auVar18._8_8_;
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  auVar18 = sha1nexte_sha(auVar19,auVar16);
  auVar12._8_8_ = MSG2[0] ^ MSG0[0];
  auVar12._0_8_ = MSG3[1] ^ MSG1[1];
  auVar19 = sha1msg2_sha(auVar12,auVar16);
  auVar18 = sha1rnds4_sha(auVar17,auVar18,1);
  auVar20 = sha1msg1_sha(auVar20,auVar16);
  MASK[1] = auVar15._0_8_;
  MSG3[0] = auVar15._8_8_;
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  auVar15 = sha1nexte_sha(auVar17,auVar19);
  auVar11._8_8_ = MSG3[0] ^ MSG1[0];
  auVar11._0_8_ = MASK[1] ^ MSG2[1];
  auVar17 = sha1msg2_sha(auVar11,auVar19);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,1);
  auVar16 = sha1msg1_sha(auVar16,auVar19);
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar17);
  auVar10._8_8_ = MSG0[0] ^ MSG2[0];
  auVar10._0_8_ = MSG1[1] ^ MSG3[1];
  auVar20 = sha1msg2_sha(auVar10,auVar17);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,1);
  auVar19 = sha1msg1_sha(auVar19,auVar17);
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar20);
  auVar9._8_8_ = MSG1[0] ^ MSG3[0];
  auVar9._0_8_ = MSG2[1] ^ MASK[1];
  auVar16 = sha1msg2_sha(auVar9,auVar20);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,1);
  auVar17 = sha1msg1_sha(auVar17,auVar20);
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar16);
  auVar8._8_8_ = MSG2[0] ^ MSG0[0];
  auVar8._0_8_ = MSG3[1] ^ MSG1[1];
  auVar19 = sha1msg2_sha(auVar8,auVar16);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,1);
  auVar20 = sha1msg1_sha(auVar20,auVar16);
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar19);
  auVar7._8_8_ = MSG3[0] ^ MSG1[0];
  auVar7._0_8_ = MASK[1] ^ MSG2[1];
  auVar17 = sha1msg2_sha(auVar7,auVar19);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,2);
  auVar16 = sha1msg1_sha(auVar16,auVar19);
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar17);
  auVar6._8_8_ = MSG0[0] ^ MSG2[0];
  auVar6._0_8_ = MSG1[1] ^ MSG3[1];
  auVar20 = sha1msg2_sha(auVar6,auVar17);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,2);
  auVar19 = sha1msg1_sha(auVar19,auVar17);
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar20);
  auVar5._8_8_ = MSG1[0] ^ MSG3[0];
  auVar5._0_8_ = MSG2[1] ^ MASK[1];
  auVar16 = sha1msg2_sha(auVar5,auVar20);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,2);
  auVar17 = sha1msg1_sha(auVar17,auVar20);
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar16);
  auVar4._8_8_ = MSG2[0] ^ MSG0[0];
  auVar4._0_8_ = MSG3[1] ^ MSG1[1];
  auVar19 = sha1msg2_sha(auVar4,auVar16);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,2);
  auVar20 = sha1msg1_sha(auVar20,auVar16);
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar19);
  auVar3._8_8_ = MSG3[0] ^ MSG1[0];
  auVar3._0_8_ = MASK[1] ^ MSG2[1];
  auVar17 = sha1msg2_sha(auVar3,auVar19);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,2);
  auVar16 = sha1msg1_sha(auVar16,auVar19);
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar17);
  auVar2._8_8_ = MSG0[0] ^ MSG2[0];
  auVar2._0_8_ = MSG1[1] ^ MSG3[1];
  auVar20 = sha1msg2_sha(auVar2,auVar17);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,3);
  auVar19 = sha1msg1_sha(auVar19,auVar17);
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  MSG1[1] = auVar20._0_8_;
  MSG0[0] = auVar20._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar20);
  auVar1._8_8_ = MSG1[0] ^ MSG3[0];
  auVar1._0_8_ = MSG2[1] ^ MASK[1];
  auVar16 = sha1msg2_sha(auVar1,auVar20);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,3);
  auVar17 = sha1msg1_sha(auVar17,auVar20);
  MSG3[1] = auVar19._0_8_;
  MSG2[0] = auVar19._8_8_;
  MSG2[1] = auVar16._0_8_;
  MSG1[0] = auVar16._8_8_;
  auVar18 = sha1nexte_sha(auVar18,auVar16);
  auVar20._8_8_ = MSG2[0] ^ MSG0[0];
  auVar20._0_8_ = MSG3[1] ^ MSG1[1];
  auVar16 = sha1msg2_sha(auVar20,auVar16);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,3);
  MASK[1] = auVar17._0_8_;
  MSG3[0] = auVar17._8_8_;
  auVar15 = sha1nexte_sha(auVar15,auVar16);
  auVar19._8_8_ = MSG3[0] ^ MSG1[0];
  auVar19._0_8_ = MASK[1] ^ MSG2[1];
  auVar17 = sha1msg2_sha(auVar19,auVar16);
  auVar15 = sha1rnds4_sha(auVar18,auVar15,3);
  auVar18 = sha1nexte_sha(auVar18,auVar17);
  auVar18 = sha1rnds4_sha(auVar15,auVar18,3);
  local_8b8 = auVar18._0_4_;
  iStack_8b4 = auVar18._4_4_;
  iStack_8b0 = auVar18._8_4_;
  iStack_8ac = auVar18._12_4_;
  local_8c8 = (int)(*core)[0];
  iStack_8c4 = (int)((ulong)(*core)[0] >> 0x20);
  iStack_8c0 = (int)(*core)[1];
  iStack_8bc = (int)((ulong)(*core)[1] >> 0x20);
  *(int *)*core = local_8b8 + local_8c8;
  *(int *)((long)*core + 4) = iStack_8b4 + iStack_8c4;
  *(int *)(*core + 1) = iStack_8b0 + iStack_8c0;
  *(int *)((long)*core + 0xc) = iStack_8ac + iStack_8bc;
  alVar21 = (__m128i)sha1nexte_sha(auVar15,(undefined1  [16])core[1]);
  core[1] = alVar21;
  return;
}

Assistant:

static inline void sha1_ni_block(__m128i *core, const uint8_t *p)
{
    __m128i ABCD, E0, E1, MSG0, MSG1, MSG2, MSG3;
    const __m128i MASK = _mm_set_epi64x(
        0x0001020304050607ULL, 0x08090a0b0c0d0e0fULL);

    const __m128i *block = (const __m128i *)p;

    /* Load initial values */
    ABCD = core[0];
    E0 = core[1];

    /* Rounds 0-3 */
    MSG0 = _mm_loadu_si128(block);
    MSG0 = _mm_shuffle_epi8(MSG0, MASK);
    E0 = _mm_add_epi32(E0, MSG0);
    E1 = ABCD;
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);

    /* Rounds 4-7 */
    MSG1 = _mm_loadu_si128(block + 1);
    MSG1 = _mm_shuffle_epi8(MSG1, MASK);
    E1 = _mm_sha1nexte_epu32(E1, MSG1);
    E0 = ABCD;
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
    MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);

    /* Rounds 8-11 */
    MSG2 = _mm_loadu_si128(block + 2);
    MSG2 = _mm_shuffle_epi8(MSG2, MASK);
    E0 = _mm_sha1nexte_epu32(E0, MSG2);
    E1 = ABCD;
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
    MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
    MSG0 = _mm_xor_si128(MSG0, MSG2);

    /* Rounds 12-15 */
    MSG3 = _mm_loadu_si128(block + 3);
    MSG3 = _mm_shuffle_epi8(MSG3, MASK);
    E1 = _mm_sha1nexte_epu32(E1, MSG3);
    E0 = ABCD;
    MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 0);
    MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
    MSG1 = _mm_xor_si128(MSG1, MSG3);

    /* Rounds 16-19 */
    E0 = _mm_sha1nexte_epu32(E0, MSG0);
    E1 = ABCD;
    MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 0);
    MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
    MSG2 = _mm_xor_si128(MSG2, MSG0);

    /* Rounds 20-23 */
    E1 = _mm_sha1nexte_epu32(E1, MSG1);
    E0 = ABCD;
    MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
    MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
    MSG3 = _mm_xor_si128(MSG3, MSG1);

    /* Rounds 24-27 */
    E0 = _mm_sha1nexte_epu32(E0, MSG2);
    E1 = ABCD;
    MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
    MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
    MSG0 = _mm_xor_si128(MSG0, MSG2);

    /* Rounds 28-31 */
    E1 = _mm_sha1nexte_epu32(E1, MSG3);
    E0 = ABCD;
    MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
    MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
    MSG1 = _mm_xor_si128(MSG1, MSG3);

    /* Rounds 32-35 */
    E0 = _mm_sha1nexte_epu32(E0, MSG0);
    E1 = ABCD;
    MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 1);
    MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
    MSG2 = _mm_xor_si128(MSG2, MSG0);

    /* Rounds 36-39 */
    E1 = _mm_sha1nexte_epu32(E1, MSG1);
    E0 = ABCD;
    MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 1);
    MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
    MSG3 = _mm_xor_si128(MSG3, MSG1);

    /* Rounds 40-43 */
    E0 = _mm_sha1nexte_epu32(E0, MSG2);
    E1 = ABCD;
    MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
    MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
    MSG0 = _mm_xor_si128(MSG0, MSG2);

    /* Rounds 44-47 */
    E1 = _mm_sha1nexte_epu32(E1, MSG3);
    E0 = ABCD;
    MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
    MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
    MSG1 = _mm_xor_si128(MSG1, MSG3);

    /* Rounds 48-51 */
    E0 = _mm_sha1nexte_epu32(E0, MSG0);
    E1 = ABCD;
    MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
    MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
    MSG2 = _mm_xor_si128(MSG2, MSG0);

    /* Rounds 52-55 */
    E1 = _mm_sha1nexte_epu32(E1, MSG1);
    E0 = ABCD;
    MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 2);
    MSG0 = _mm_sha1msg1_epu32(MSG0, MSG1);
    MSG3 = _mm_xor_si128(MSG3, MSG1);

    /* Rounds 56-59 */
    E0 = _mm_sha1nexte_epu32(E0, MSG2);
    E1 = ABCD;
    MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 2);
    MSG1 = _mm_sha1msg1_epu32(MSG1, MSG2);
    MSG0 = _mm_xor_si128(MSG0, MSG2);

    /* Rounds 60-63 */
    E1 = _mm_sha1nexte_epu32(E1, MSG3);
    E0 = ABCD;
    MSG0 = _mm_sha1msg2_epu32(MSG0, MSG3);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
    MSG2 = _mm_sha1msg1_epu32(MSG2, MSG3);
    MSG1 = _mm_xor_si128(MSG1, MSG3);

    /* Rounds 64-67 */
    E0 = _mm_sha1nexte_epu32(E0, MSG0);
    E1 = ABCD;
    MSG1 = _mm_sha1msg2_epu32(MSG1, MSG0);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);
    MSG3 = _mm_sha1msg1_epu32(MSG3, MSG0);
    MSG2 = _mm_xor_si128(MSG2, MSG0);

    /* Rounds 68-71 */
    E1 = _mm_sha1nexte_epu32(E1, MSG1);
    E0 = ABCD;
    MSG2 = _mm_sha1msg2_epu32(MSG2, MSG1);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);
    MSG3 = _mm_xor_si128(MSG3, MSG1);

    /* Rounds 72-75 */
    E0 = _mm_sha1nexte_epu32(E0, MSG2);
    E1 = ABCD;
    MSG3 = _mm_sha1msg2_epu32(MSG3, MSG2);
    ABCD = _mm_sha1rnds4_epu32(ABCD, E0, 3);

    /* Rounds 76-79 */
    E1 = _mm_sha1nexte_epu32(E1, MSG3);
    E0 = ABCD;
    ABCD = _mm_sha1rnds4_epu32(ABCD, E1, 3);

    /* Combine state */
    core[0] = _mm_add_epi32(ABCD, core[0]);
    core[1] = _mm_sha1nexte_epu32(E0, core[1]);
}